

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

char * fmt::v7::detail::
       parse_replacement_field<char,fmt::v7::detail::format_handler<fmt::v7::detail::buffer_appender<char>,char,fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,char>>&>
                 (char *begin,char *end,
                 format_handler<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                 *handler)

{
  uint uVar1;
  undefined1 value [16];
  undefined1 value_00 [16];
  buffer_appender<char> out;
  buffer_appender<char> out_00;
  error_handler eVar2;
  error_handler *begin_00;
  int in_ECX;
  ulong uVar3;
  char *pcVar4;
  error_handler *this;
  basic_format_specs<char> specs;
  format_arg arg;
  id_adapter<fmt::v7::detail::format_handler<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_&,_char>
  adapter;
  unkbyte10 in_stack_ffffffffffffff68;
  undefined6 in_stack_ffffffffffffff72;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  local_88;
  int local_78;
  id_adapter<fmt::v7::detail::format_handler<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_&,_char>
  local_68;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined4 local_48;
  buffer<char> *local_40;
  undefined4 local_38;
  undefined4 uStack_34;
  undefined4 uStack_30;
  undefined4 uStack_2c;
  void *local_28;
  
  begin_00 = (error_handler *)(begin + 1);
  if (begin_00 == (error_handler *)end) {
    error_handler::on_error((error_handler *)begin,"invalid format string");
  }
  if (*begin_00 == (error_handler)0x7b) {
    format_handler<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    ::on_text(handler,(char *)begin_00,begin + 2);
    goto LAB_004e55b0;
  }
  if (*begin_00 != (error_handler)0x7d) {
    local_68.arg_id = 0;
    this = begin_00;
    local_68.handler = handler;
    begin_00 = (error_handler *)
               parse_arg_id<char,fmt::v7::detail::id_adapter<fmt::v7::detail::format_handler<fmt::v7::detail::buffer_appender<char>,char,fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,char>>&,char>&>
                         ((char *)begin_00,end,&local_68);
    if (begin_00 == (error_handler *)end) {
      eVar2 = (error_handler)0x0;
    }
    else {
      eVar2 = *begin_00;
    }
    if (eVar2 == (error_handler)0x3a) {
      begin_00 = (error_handler *)
                 format_handler<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                 ::on_format_specs(handler,local_68.arg_id,(char *)(begin_00 + 1),end);
      if ((begin_00 == (error_handler *)end) || (*begin_00 != (error_handler)0x7d)) {
        error_handler::on_error((error_handler *)handler,"unknown format specifier");
      }
      goto LAB_004e55b0;
    }
    if (eVar2 != (error_handler)0x7d) {
      error_handler::on_error(this,"missing \'}\' in format string");
    }
    get_arg<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,char>,int>
              ((format_arg *)&local_88.string,(detail *)&handler->context,
               (basic_format_context<fmt::v7::detail::buffer_appender<char>,_char> *)
               (ulong)(uint)local_68.arg_id,in_ECX);
    if (0xe < local_78 - 1U) goto LAB_004e55e6;
    local_40 = (handler->context).out_.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
               container;
    switch(local_78) {
    case 2:
      goto switchD_004e537a_caseD_2;
    case 3:
      goto switchD_004e537a_caseD_3;
    case 4:
      goto switchD_004e537a_caseD_4;
    case 5:
      goto switchD_004e537a_caseD_5;
    case 6:
      goto switchD_004e537a_caseD_6;
    case 7:
      goto switchD_004e537a_caseD_7;
    case 8:
      goto switchD_004e537a_caseD_8;
    case 9:
      goto switchD_004e537a_caseD_9;
    case 10:
      goto switchD_004e537a_caseD_a;
    case 0xb:
      goto switchD_004e537a_caseD_b;
    case 0xc:
      goto switchD_004e537a_caseD_c;
    case 0xd:
      goto switchD_004e537a_caseD_d;
    case 0xe:
      goto switchD_004e537a_caseD_e;
    case 0xf:
      goto switchD_004e537a_caseD_f;
    }
switchD_004e537a_caseD_1:
    local_40 = (buffer<char> *)
               write<char,_fmt::v7::detail::buffer_appender<char>,_int,_0>
                         ((buffer_appender<char>)local_40,local_88.int_value);
    goto LAB_004e55ad;
  }
  uVar1 = (handler->parse_context).next_arg_id_;
  if ((int)uVar1 < 0) {
    error_handler::on_error
              ((error_handler *)begin,"cannot switch from manual to automatic argument indexing");
  }
  (handler->parse_context).next_arg_id_ = uVar1 + 1;
  get_arg<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,char>,int>
            ((format_arg *)&local_88.string,(detail *)&handler->context,
             (basic_format_context<fmt::v7::detail::buffer_appender<char>,_char> *)(ulong)uVar1,
             in_ECX);
  if (0xe < local_78 - 1U) {
LAB_004e55e6:
    assert_fail("/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/src/include/fmt/format.h"
                ,0x7d7,"");
  }
  local_40 = (handler->context).out_.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
             container;
  switch(local_78) {
  case 1:
    goto switchD_004e537a_caseD_1;
  case 2:
switchD_004e537a_caseD_2:
    local_40 = (buffer<char> *)
               write<char,_fmt::v7::detail::buffer_appender<char>,_unsigned_int,_0>
                         ((buffer_appender<char>)local_40,local_88.uint_value);
    break;
  case 3:
switchD_004e537a_caseD_3:
    local_40 = (buffer<char> *)
               write<char,_fmt::v7::detail::buffer_appender<char>,_long_long,_0>
                         ((buffer_appender<char>)local_40,
                          CONCAT44(local_88.long_long_value._4_4_,local_88.int_value));
    break;
  case 4:
switchD_004e537a_caseD_4:
    local_40 = (buffer<char> *)
               write<char,_fmt::v7::detail::buffer_appender<char>,_unsigned_long_long,_0>
                         ((buffer_appender<char>)local_40,
                          CONCAT44(local_88.long_long_value._4_4_,local_88.int_value));
    break;
  case 5:
switchD_004e537a_caseD_5:
    out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container._4_4_ =
         local_88.long_long_value._4_4_;
    out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container._0_4_ =
         local_88.int_value;
    value._10_6_ = in_stack_ffffffffffffff72;
    value._0_10_ = in_stack_ffffffffffffff68;
    local_40 = (buffer<char> *)
               write<char,_fmt::v7::detail::buffer_appender<char>,___int128,_0>
                         ((detail *)local_40,out,(__int128)value);
    break;
  case 6:
switchD_004e537a_caseD_6:
    out_00.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container._4_4_ =
         local_88.long_long_value._4_4_;
    out_00.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container._0_4_ =
         local_88.int_value;
    value_00._10_6_ = in_stack_ffffffffffffff72;
    value_00._0_10_ = in_stack_ffffffffffffff68;
    local_40 = (buffer<char> *)
               write<char,_fmt::v7::detail::buffer_appender<char>,_unsigned___int128,_0>
                         ((detail *)local_40,out_00,(unsigned___int128)value_00);
    break;
  case 7:
switchD_004e537a_caseD_7:
    pcVar4 = "IsValid_false";
    if ((ulong)local_88.bool_value != 0) {
      pcVar4 = "IsValid_true";
    }
    pcVar4 = pcVar4 + 8;
    uVar3 = (ulong)local_88.bool_value ^ 5;
    goto LAB_004e5568;
  case 8:
switchD_004e537a_caseD_8:
    local_40 = (buffer<char> *)
               write<char,fmt::v7::detail::buffer_appender<char>>
                         ((buffer_appender<char>)local_40,local_88.char_value);
    break;
  case 9:
switchD_004e537a_caseD_9:
    local_40 = (buffer<char> *)
               write<char,_fmt::v7::detail::buffer_appender<char>,_float,_0>
                         ((buffer_appender<char>)local_40,local_88.float_value);
    break;
  case 10:
switchD_004e537a_caseD_a:
    local_40 = (buffer<char> *)
               write<char,_fmt::v7::detail::buffer_appender<char>,_double,_0>
                         ((buffer_appender<char>)local_40,
                          (double)CONCAT44(local_88.long_long_value._4_4_,local_88.int_value));
    break;
  case 0xb:
switchD_004e537a_caseD_b:
    specs.type = '\0';
    specs._9_1_ = 0;
    specs.fill.data_[0] = ' ';
    specs.fill.data_[1] = '\0';
    specs.fill.data_[2] = '\0';
    specs.fill.data_[3] = '\0';
    specs.fill.size_ = '\x01';
    specs._15_1_ = 0;
    specs.width = 0;
    specs.precision = -1;
    local_40 = (buffer<char> *)
               write<char,_fmt::v7::detail::buffer_appender<char>,_long_double,_0>
                         ((buffer_appender<char>)local_40,
                          (longdouble)
                          CONCAT28(local_88.int128_value._8_2_,
                                   CONCAT44(local_88.long_long_value._4_4_,local_88.int_value)),
                          specs,(locale_ref)0x0);
    break;
  case 0xc:
switchD_004e537a_caseD_c:
    local_40 = (buffer<char> *)
               write<char,fmt::v7::detail::buffer_appender<char>>
                         ((buffer_appender<char>)local_40,
                          (char *)CONCAT44(local_88.long_long_value._4_4_,local_88.int_value));
    break;
  case 0xd:
switchD_004e537a_caseD_d:
    pcVar4 = (char *)CONCAT44(local_88.long_long_value._4_4_,local_88.int_value);
    uVar3 = CONCAT62(local_88.int128_value._10_6_,local_88.int128_value._8_2_);
LAB_004e5568:
    buffer<char>::append<char>(local_40,pcVar4,pcVar4 + uVar3);
    break;
  case 0xe:
switchD_004e537a_caseD_e:
    local_40 = (buffer<char> *)
               write_ptr<char,fmt::v7::detail::buffer_appender<char>,unsigned_long>
                         ((buffer_appender<char>)local_40,
                          CONCAT44(local_88.long_long_value._4_4_,local_88.int_value),
                          (basic_format_specs<char> *)0x0);
    break;
  case 0xf:
switchD_004e537a_caseD_f:
    local_28 = (handler->context).loc_.locale_;
    local_38 = (undefined4)(handler->context).args_.desc_;
    uStack_34 = *(undefined4 *)((long)&(handler->context).args_.desc_ + 4);
    uStack_30 = *(undefined4 *)&(handler->context).args_.field_1;
    uStack_2c = *(undefined4 *)((long)&(handler->context).args_.field_1 + 4);
    local_58 = 0;
    uStack_50 = 0;
    local_48 = 0;
    (*(code *)CONCAT62(local_88.int128_value._10_6_,local_88.int128_value._8_2_))
              (CONCAT44(local_88.long_long_value._4_4_,local_88.int_value),&local_58,&local_40);
  }
LAB_004e55ad:
  (handler->context).out_.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container =
       local_40;
LAB_004e55b0:
  return (char *)(begin_00 + 1);
}

Assistant:

FMT_CONSTEXPR const Char* parse_replacement_field(const Char* begin,
                                                  const Char* end,
                                                  Handler&& handler) {
  ++begin;
  if (begin == end) return handler.on_error("invalid format string"), end;
  if (*begin == '}') {
    handler.on_replacement_field(handler.on_arg_id(), begin);
  } else if (*begin == '{') {
    handler.on_text(begin, begin + 1);
  } else {
    auto adapter = id_adapter<Handler, Char>{handler, 0};
    begin = parse_arg_id(begin, end, adapter);
    Char c = begin != end ? *begin : Char();
    if (c == '}') {
      handler.on_replacement_field(adapter.arg_id, begin);
    } else if (c == ':') {
      begin = handler.on_format_specs(adapter.arg_id, begin + 1, end);
      if (begin == end || *begin != '}')
        return handler.on_error("unknown format specifier"), end;
    } else {
      return handler.on_error("missing '}' in format string"), end;
    }
  }
  return begin + 1;
}